

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O2

void __thiscall wasm::ReferenceFinder::visitCallIndirect(ReferenceFinder *this,CallIndirect *curr)

{
  size_t sVar1;
  char *pcVar2;
  value_type local_48;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  sVar1 = (curr->table).super_IString.str._M_len;
  pcVar2 = (curr->table).super_IString.str._M_str;
  local_28 = (undefined4)sVar1;
  uStack_24 = (undefined4)(sVar1 >> 0x20);
  uStack_20 = SUB84(pcVar2,0);
  uStack_1c = (undefined4)((ulong)pcVar2 >> 0x20);
  local_48.first = Table;
  local_48.second.super_IString.str._M_len._0_4_ = local_28;
  local_48._4_4_ = uStack_2c;
  local_48.second.super_IString.str._M_str._0_4_ = uStack_20;
  local_48.second.super_IString.str._M_len._4_4_ = uStack_24;
  local_48.second.super_IString.str._M_str._4_4_ = uStack_1c;
  std::
  vector<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleItemKind,_wasm::Name>_>_>
  ::push_back(&this->elements,&local_48);
  noteCallRef(this,(HeapType)(curr->heapType).id);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    note({ModuleElementKind::Table, curr->table});
    // Note a possible call of a function reference as well, as something might
    // be written into the table during runtime. With precise tracking of what
    // is written into the table we could do better here; we could also see
    // which tables are immutable. TODO
    noteCallRef(curr->heapType);
  }